

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void strftimeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uchar uVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  int iVar5;
  uchar *puVar6;
  char *pcVar7;
  char cVar8;
  char c;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  char *pcVar13;
  ulong uVar14;
  double dVar15;
  sqlite3_str sRes;
  DateTime x;
  DateTime y;
  sqlite3_str local_58;
  ulong uVar12;
  
  if (argc != 0) {
    puVar6 = sqlite3_value_text(*argv);
    if ((puVar6 != (uchar *)0x0) && (iVar5 = isDate(context,argc + -1,argv + 1,&x), iVar5 == 0)) {
      local_58.mxAlloc = context->pOut->db->aLimit[0];
      local_58.db = (sqlite3 *)0x0;
      local_58.zText = (char *)0x0;
      local_58.nAlloc = 0;
      local_58.nChar = 0;
      local_58.accError = '\0';
      local_58.printfFlags = '\0';
      computeJD(&x);
      computeYMD_HMS(&x);
      uVar14 = 0;
      uVar11 = 0;
      while( true ) {
        if (puVar6[uVar11] != '%') break;
        if (uVar14 < uVar11) {
          sqlite3_str_append(&local_58,(char *)(puVar6 + uVar14),(int)uVar11 - (int)uVar14);
        }
        uVar4 = y._40_8_;
        uVar12 = uVar11 + 1;
        uVar1 = puVar6[uVar11 + 1];
        uVar14 = uVar11 + 2;
        y.validJD = x.validJD;
        y._40_8_ = uVar4;
        switch(uVar1) {
        case 'F':
          pcVar13 = "%04d-%02d-%02d";
          uVar9 = x.M;
          uVar2 = x.Y;
          uVar3 = x.D;
          goto LAB_00190299;
        case 'G':
        case 'g':
          y.Y = x.Y;
          y.s = x.s;
          uVar11 = (x.iJD + 43200000) / 86400000;
          y.iJD = x.iJD + (3 - (int)((long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 |
                                           uVar11 & 0xffffffff) % 7)) * 86400000;
          y._42_6_ = SUB86(CONCAT44(x._44_4_,x._40_4_) >> 0x10,0);
          y.validYMD = '\0';
          computeYMD(&y);
          if (uVar1 == 'g') {
            uVar11 = (long)y.Y % 100 & 0xffffffff;
            goto LAB_00190261;
          }
          pcVar13 = "%04d";
          goto LAB_001901c1;
        case 'H':
        case 'k':
          pcVar13 = "%2d";
          if (uVar1 == 'H') {
            pcVar13 = "%02d";
          }
          uVar11 = (ulong)(uint)x.h;
          break;
        case 'I':
        case 'l':
          uVar9 = x.h - 0xc;
          if (x.h < 0xd) {
            uVar9 = x.h;
          }
          uVar11 = (ulong)uVar9;
          if (uVar9 == 0) {
            uVar11 = 0xc;
          }
          pcVar13 = "%2d";
          if (uVar1 == 'I') {
            pcVar13 = "%02d";
          }
          break;
        case 'J':
          dVar15 = (double)x.iJD / 86400000.0;
          pcVar13 = "%.16g";
          goto LAB_001902dd;
        case 'K':
        case 'L':
        case 'N':
        case 'O':
        case 'Q':
        case 'X':
        case 'Z':
        case '[':
        case '\\':
        case ']':
        case '^':
        case '_':
        case '`':
        case 'a':
        case 'b':
        case 'c':
        case 'h':
        case 'i':
        case 'n':
        case 'o':
        case 'q':
        case 'r':
        case 't':
        case 'v':
switchD_0018ff2a_caseD_4b:
          sqlite3_str_reset(&local_58);
          return;
        case 'M':
          uVar11 = (ulong)(uint)x.m;
          goto LAB_00190261;
        case 'P':
        case 'p':
          if (x.h < 0xc) {
            pcVar13 = "am";
            pcVar7 = "AM";
          }
          else {
            pcVar13 = "pm";
            pcVar7 = "PM";
          }
          if (uVar1 == 'p') {
            pcVar13 = pcVar7;
          }
          sqlite3_str_append(&local_58,pcVar13,2);
          goto LAB_00190275;
        case 'R':
          sqlite3_str_appendf(&local_58,"%02d:%02d",(ulong)(uint)x.h,(ulong)(uint)x.m);
          goto LAB_00190275;
        case 'S':
          uVar11 = (ulong)(uint)(int)x.s;
          goto LAB_00190261;
        case 'T':
          pcVar13 = "%02d:%02d:%02d";
          uVar9 = x.m;
          uVar2 = x.h;
          uVar3 = (int)x.s;
LAB_00190299:
          sqlite3_str_appendf(&local_58,pcVar13,(ulong)uVar2,(ulong)uVar9,(ulong)uVar3);
          goto LAB_00190275;
        case 'U':
          iVar5 = daysAfterJan01(&x);
          lVar10 = 0x7b98a00;
          goto LAB_00190199;
        case 'V':
          y.s = x.s;
          uVar11 = (x.iJD + 43200000) / 86400000;
          y.iJD = x.iJD + (3 - (int)((long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 |
                                           uVar11 & 0xffffffff) % 7)) * 86400000;
          y._42_6_ = SUB86(CONCAT44(x._44_4_,x._40_4_) >> 0x10,0);
          y.validYMD = '\0';
          computeYMD(&y);
          iVar5 = daysAfterJan01(&y);
          uVar11 = (ulong)(iVar5 / 7 + 1);
          goto LAB_00190261;
        case 'W':
          iVar5 = daysAfterJan01(&x);
          lVar10 = 43200000;
LAB_00190199:
          uVar11 = (x.iJD + lVar10) / 86400000;
          y.Y = ((iVar5 - (int)((long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 |
                                      uVar11 & 0xffffffff) % 7)) + 7) / 7;
          pcVar13 = "%02d";
LAB_001901c1:
          uVar11 = (ulong)(uint)y.Y;
          break;
        case 'Y':
          uVar11 = (ulong)(uint)x.Y;
          pcVar13 = "%04d";
          break;
        case 'd':
        case 'e':
          pcVar13 = "%2d";
          if (uVar1 == 'd') {
            pcVar13 = "%02d";
          }
          uVar11 = (ulong)(uint)x.D;
          break;
        case 'f':
          dVar15 = 59.999;
          if (x.s <= 59.999) {
            dVar15 = x.s;
          }
          pcVar13 = "%06.3f";
LAB_001902dd:
          sqlite3_str_appendf(&local_58,pcVar13,dVar15);
          goto LAB_00190275;
        case 'j':
          iVar5 = daysAfterJan01(&x);
          uVar11 = (ulong)(iVar5 + 1);
          pcVar13 = "%03d";
          break;
        case 'm':
          uVar11 = (ulong)(uint)x.M;
LAB_00190261:
          pcVar13 = "%02d";
          break;
        case 's':
          if ((x._44_4_ & 4) != 0) {
            dVar15 = (double)(x.iJD + -0xbfc83e532200) / 1000.0;
            pcVar13 = "%.3f";
            goto LAB_001902dd;
          }
          sqlite3_str_appendf(&local_58,"%lld",x.iJD / 1000 + -0x3118a36940);
          goto LAB_00190275;
        case 'u':
        case 'w':
          uVar11 = (x.iJD + 0x7b98a00) / 86400000;
          lVar10 = (long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff) % 7;
          cVar8 = (char)lVar10 + '0';
          c = cVar8;
          if ((int)lVar10 == 0) {
            c = '7';
          }
          if (uVar1 != 'u') {
            c = cVar8;
          }
          goto LAB_0019007e;
        default:
          if (uVar1 != '%') goto switchD_0018ff2a_caseD_4b;
          c = '%';
LAB_0019007e:
          sqlite3_str_appendchar(&local_58,1,c);
          goto LAB_00190275;
        }
        sqlite3_str_appendf(&local_58,pcVar13,uVar11);
LAB_00190275:
        uVar11 = uVar12 + 1;
      }
      uVar12 = uVar11;
      if (puVar6[uVar11] != '\0') goto LAB_00190275;
      if (uVar14 < uVar11) {
        sqlite3_str_append(&local_58,(char *)(puVar6 + uVar14),(int)uVar11 - (int)uVar14);
      }
      sqlite3ResultStrAccum(context,&local_58);
    }
  }
  return;
}

Assistant:

static void strftimeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  size_t i,j;
  sqlite3 *db;
  const char *zFmt;
  sqlite3_str sRes;


  if( argc==0 ) return;
  zFmt = (const char*)sqlite3_value_text(argv[0]);
  if( zFmt==0 || isDate(context, argc-1, argv+1, &x) ) return;
  db = sqlite3_context_db_handle(context);
  sqlite3StrAccumInit(&sRes, 0, 0, 0, db->aLimit[SQLITE_LIMIT_LENGTH]);

  computeJD(&x);
  computeYMD_HMS(&x);
  for(i=j=0; zFmt[i]; i++){
    char cf;
    if( zFmt[i]!='%' ) continue;
    if( j<i ) sqlite3_str_append(&sRes, zFmt+j, (int)(i-j));
    i++;
    j = i + 1;
    cf = zFmt[i];
    switch( cf ){
      case 'd':  /* Fall thru */
      case 'e': {
        sqlite3_str_appendf(&sRes, cf=='d' ? "%02d" : "%2d", x.D);
        break;
      }
      case 'f': {  /* Fractional seconds.  (Non-standard) */
        double s = x.s;
        if( s>59.999 ) s = 59.999;
        sqlite3_str_appendf(&sRes, "%06.3f", s);
        break;
      }
      case 'F': {
        sqlite3_str_appendf(&sRes, "%04d-%02d-%02d", x.Y, x.M, x.D);
        break;
      }
      case 'G': /* Fall thru */
      case 'g': {
        DateTime y = x;
        assert( y.validJD );
        /* Move y so that it is the Thursday in the same week as x */
        y.iJD += (3 - daysAfterMonday(&x))*86400000;
        y.validYMD = 0;
        computeYMD(&y);
        if( cf=='g' ){
          sqlite3_str_appendf(&sRes, "%02d", y.Y%100);
        }else{
          sqlite3_str_appendf(&sRes, "%04d", y.Y);
        }
        break;
      }
      case 'H':
      case 'k': {
        sqlite3_str_appendf(&sRes, cf=='H' ? "%02d" : "%2d", x.h);
        break;
      }
      case 'I': /* Fall thru */
      case 'l': {
        int h = x.h;
        if( h>12 ) h -= 12;
        if( h==0 ) h = 12;
        sqlite3_str_appendf(&sRes, cf=='I' ? "%02d" : "%2d", h);
        break;
      }
      case 'j': {  /* Day of year.  Jan01==1, Jan02==2, and so forth */
        sqlite3_str_appendf(&sRes,"%03d",daysAfterJan01(&x)+1);
        break;
      }
      case 'J': {  /* Julian day number.  (Non-standard) */
        sqlite3_str_appendf(&sRes,"%.16g",x.iJD/86400000.0);
        break;
      }
      case 'm': {
        sqlite3_str_appendf(&sRes,"%02d",x.M);
        break;
      }
      case 'M': {
        sqlite3_str_appendf(&sRes,"%02d",x.m);
        break;
      }
      case 'p': /* Fall thru */
      case 'P': {
        if( x.h>=12 ){
          sqlite3_str_append(&sRes, cf=='p' ? "PM" : "pm", 2);
        }else{
          sqlite3_str_append(&sRes, cf=='p' ? "AM" : "am", 2);
        }
        break;
      }
      case 'R': {
        sqlite3_str_appendf(&sRes, "%02d:%02d", x.h, x.m);
        break;
      }
      case 's': {
        if( x.useSubsec ){
          sqlite3_str_appendf(&sRes,"%.3f",
                (x.iJD - 21086676*(i64)10000000)/1000.0);
        }else{
          i64 iS = (i64)(x.iJD/1000 - 21086676*(i64)10000);
          sqlite3_str_appendf(&sRes,"%lld",iS);
        }
        break;
      }
      case 'S': {
        sqlite3_str_appendf(&sRes,"%02d",(int)x.s);
        break;
      }
      case 'T': {
        sqlite3_str_appendf(&sRes,"%02d:%02d:%02d", x.h, x.m, (int)x.s);
        break;
      }
      case 'u':    /* Day of week.  1 to 7.  Monday==1, Sunday==7 */
      case 'w': {  /* Day of week.  0 to 6.  Sunday==0, Monday==1 */
        char c = (char)daysAfterSunday(&x) + '0';
        if( c=='0' && cf=='u' ) c = '7';
        sqlite3_str_appendchar(&sRes, 1, c);
        break;
      }
      case 'U': {  /* Week num. 00-53. First Sun of the year is week 01 */
        sqlite3_str_appendf(&sRes,"%02d",
              (daysAfterJan01(&x)-daysAfterSunday(&x)+7)/7);
        break;
      }
      case 'V': {  /* Week num. 01-53. First week with a Thur is week 01 */
        DateTime y = x;
        /* Adjust y so that is the Thursday in the same week as x */
        assert( y.validJD );
        y.iJD += (3 - daysAfterMonday(&x))*86400000;
        y.validYMD = 0;
        computeYMD(&y);
        sqlite3_str_appendf(&sRes,"%02d", daysAfterJan01(&y)/7+1);
        break;
      }
      case 'W': {  /* Week num. 00-53. First Mon of the year is week 01 */
        sqlite3_str_appendf(&sRes,"%02d",
           (daysAfterJan01(&x)-daysAfterMonday(&x)+7)/7);
        break;
      }
      case 'Y': {
        sqlite3_str_appendf(&sRes,"%04d",x.Y);
        break;
      }
      case '%': {
        sqlite3_str_appendchar(&sRes, 1, '%');
        break;
      }
      default: {
        sqlite3_str_reset(&sRes);
        return;
      }
    }
  }
  if( j<i ) sqlite3_str_append(&sRes, zFmt+j, (int)(i-j));
  sqlite3ResultStrAccum(context, &sRes);
}